

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

s_level * get_next_elemental_plane(d_level *lev)

{
  char cVar1;
  s_level *psVar2;
  s_level **ppsVar3;
  s_level *psVar4;
  
  cVar1 = lev->dnum;
  if (cVar1 == dungeon_topology.d_astral_level.dnum) {
    find_level("astral");
    ppsVar3 = &sp_levchn;
    psVar2 = (s_level *)0x0;
    do {
      psVar4 = psVar2;
      ppsVar3 = &((s_level *)ppsVar3)->next->next;
      if ((s_level *)ppsVar3 == (s_level *)0x0) {
        return (s_level *)0x0;
      }
      psVar2 = (s_level *)ppsVar3;
    } while ((cVar1 != (((s_level *)ppsVar3)->dlevel).dnum) ||
            (lev->dlevel != (((s_level *)ppsVar3)->dlevel).dlevel));
  }
  else {
    psVar4 = (s_level *)0x0;
    pline("get_next_elemental_plane not in Endgame.");
  }
  return psVar4;
}

Assistant:

s_level *get_next_elemental_plane(const d_level *lev)
{
	if (!In_endgame(lev)) {
	    pline("get_next_elemental_plane not in Endgame.");
	    return NULL;
	}

	s_level *curr = find_level("astral"),
		*plane = NULL;
	for (curr = sp_levchn; curr; curr = curr->next) {
	    if (on_level(lev, &(curr->dlevel)))
		return plane;
	    plane = curr;
	}
	return NULL;
}